

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DebugNodeViewport(ImGuiViewportP *viewport)

{
  uint uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  ImVector<ImDrawList_*> *pIVar6;
  int draw_list_i;
  long lVar7;
  int layer_i;
  long lVar8;
  
  SetNextItemOpen(true,2);
  bVar2 = TreeNode("viewport0","Viewport #%d",0);
  if (bVar2) {
    uVar1 = (viewport->super_ImGuiViewport).Flags;
    BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f"
               ,(double)(viewport->super_ImGuiViewport).Pos.x,
               (double)(viewport->super_ImGuiViewport).Pos.y,
               (double)(viewport->super_ImGuiViewport).Size.x,
               (double)(viewport->super_ImGuiViewport).Size.y,(double)(viewport->WorkOffsetMin).x,
               (double)(viewport->WorkOffsetMin).y,(double)(viewport->WorkOffsetMax).x,
               (double)(viewport->WorkOffsetMax).y);
    pcVar4 = " IsPlatformWindow";
    if ((uVar1 & 1) == 0) {
      pcVar4 = "";
    }
    pcVar3 = " IsPlatformMonitor";
    if ((uVar1 & 2) == 0) {
      pcVar3 = "";
    }
    pcVar5 = " OwnedByApp";
    if ((uVar1 & 4) == 0) {
      pcVar5 = "";
    }
    BulletText("Flags: 0x%04X =%s%s%s",(ulong)(uint)(viewport->super_ImGuiViewport).Flags,pcVar4,
               pcVar3,pcVar5);
    for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
      pIVar6 = (viewport->DrawDataBuilder).Layers + lVar8;
      for (lVar7 = 0; lVar7 < pIVar6->Size; lVar7 = lVar7 + 1) {
        DebugNodeDrawList((ImGuiWindow *)0x0,pIVar6->Data[lVar7],"DrawList");
      }
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeViewport(ImGuiViewportP* viewport)
{
    SetNextItemOpen(true, ImGuiCond_Once);
    if (TreeNode("viewport0", "Viewport #%d", 0))
    {
        ImGuiWindowFlags flags = viewport->Flags;
        BulletText("Main Pos: (%.0f,%.0f), Size: (%.0f,%.0f)\nWorkArea Offset Left: %.0f Top: %.0f, Right: %.0f, Bottom: %.0f",
            viewport->Pos.x, viewport->Pos.y, viewport->Size.x, viewport->Size.y,
            viewport->WorkOffsetMin.x, viewport->WorkOffsetMin.y, viewport->WorkOffsetMax.x, viewport->WorkOffsetMax.y);
        BulletText("Flags: 0x%04X =%s%s%s", viewport->Flags,
            (flags & ImGuiViewportFlags_IsPlatformWindow)  ? " IsPlatformWindow"  : "",
            (flags & ImGuiViewportFlags_IsPlatformMonitor) ? " IsPlatformMonitor" : "",
            (flags & ImGuiViewportFlags_OwnedByApp)        ? " OwnedByApp"        : "");
        for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
            for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        TreePop();
    }
}